

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Const * kratos::Const::constant(string *value,uint32_t width)

{
  StringConst *pSVar1;
  uint32_t local_2c;
  StringConst *pSStack_28;
  uint32_t width_local;
  shared_ptr<kratos::StringConst> p;
  
  pSStack_28 = (StringConst *)0x0;
  local_2c = width;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::StringConst,std::allocator<kratos::StringConst>,std::__cxx11::string,unsigned_int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,&stack0xffffffffffffffd8,
             (allocator<kratos::StringConst> *)
             ((long)&p.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),value,&local_2c);
  std::__shared_ptr<kratos::StringConst,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::StringConst,kratos::StringConst>
            ((__shared_ptr<kratos::StringConst,(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd8,pSStack_28);
  std::
  _Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::StringConst>&>
            ((_Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&consts_,
             (__shared_ptr<kratos::StringConst,(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd8);
  pSVar1 = pSStack_28;
  if (p.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return &pSVar1->super_Const;
}

Assistant:

Const &Const::constant(std::string value, uint32_t width) {
    auto p = std::make_shared<StringConst>(std::move(value), width);
    consts_.emplace(p);
    return *p;
}